

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,char *rawPixelData,DeepFrameBuffer *frameBuffer,int scanLine1
          ,int scanLine2)

{
  Data *pDVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  size_t sVar5;
  Compression *pCVar6;
  Compressor *pCVar7;
  Slice *pSVar8;
  ostream *poVar9;
  ArgExc *pAVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong maxScanLineSize;
  char b [4];
  char *readPtr;
  int local_1c4;
  DeepScanLineInputFile *local_1c0;
  char *local_1b8 [2];
  ostream local_1a8 [376];
  
  iVar13 = *(int *)rawPixelData;
  pDVar1 = this->_data;
  iVar18 = iVar13 + pDVar1->linesInBuffer + -1;
  if (pDVar1->maxY < iVar18) {
    iVar18 = pDVar1->maxY;
  }
  local_1c0 = this;
  if (iVar13 == scanLine1) {
    if (iVar18 == scanLine2) {
      uVar17 = *(ulong *)(rawPixelData + 4);
      maxScanLineSize =
           (ulong)(((scanLine2 - scanLine1) * 4 + 4) * ((pDVar1->maxX - pDVar1->minX) + 1));
      if (uVar17 < maxScanLineSize) {
        pCVar6 = Header::compression(&pDVar1->header);
        pCVar7 = newCompressor(*pCVar6,maxScanLineSize,&local_1c0->_data->header);
        (*pCVar7->_vptr_Compressor[6])
                  (pCVar7,rawPixelData + 0x1c,uVar17 & 0xffffffff,(ulong)(uint)scanLine1);
      }
      else {
        local_1b8[0] = rawPixelData + 0x1c;
        pCVar7 = (Compressor *)0x0;
      }
      pSVar8 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
      pcVar2 = pSVar8->base;
      pSVar8 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
      sVar3 = pSVar8->xStride;
      pSVar8 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
      if (scanLine1 <= scanLine2) {
        sVar5 = pSVar8->yStride;
        pDVar1 = local_1c0->_data;
        lVar14 = (long)scanLine1;
        uVar17 = (ulong)(uint)pDVar1->maxX;
        pcVar12 = local_1b8[0];
        do {
          if (pDVar1->minX <= (int)uVar17) {
            lVar15 = (long)pDVar1->minX;
            iVar13 = 0;
            do {
              lVar16 = 0;
              pcVar11 = pcVar12;
              do {
                pcVar12 = pcVar11 + 1;
                local_1b8[0] = pcVar12;
                *(char *)((long)&local_1c4 + lVar16) = *pcVar11;
                lVar16 = lVar16 + 1;
                pcVar11 = pcVar12;
              } while ((int)lVar16 != 4);
              if (pDVar1->minX == (int)lVar15) {
                iVar13 = 0;
              }
              *(int *)(pcVar2 + (int)sVar3 * lVar15 + (int)sVar5 * lVar14) = local_1c4 - iVar13;
              uVar17 = (ulong)pDVar1->maxX;
              bVar4 = lVar15 < (long)uVar17;
              lVar15 = lVar15 + 1;
              iVar13 = local_1c4;
            } while (bVar4);
          }
          lVar14 = lVar14 + 1;
        } while (scanLine2 + 1 != (int)lVar14);
      }
      if (pCVar7 != (Compressor *)0x0) {
        (*pCVar7->_vptr_Compressor[1])(pCVar7);
      }
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"readPixelSampleCounts(rawPixelData,frameBuffer,",0x2f);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,scanLine1);
    local_1c4 = CONCAT31(local_1c4._1_3_,0x2c);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_1c4,1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,scanLine2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,") called with incorrect end scanline - should be ",0x31);
    std::ostream::operator<<((ostream *)poVar9,iVar18);
    pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar10,(stringstream *)local_1b8);
    __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"readPixelSampleCounts(rawPixelData,frameBuffer,",0x2f);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,scanLine1);
  local_1c4 = CONCAT31(local_1c4._1_3_,0x2c);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_1c4,1);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,scanLine2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,") called with incorrect start scanline - should be ",0x33);
  std::ostream::operator<<((ostream *)poVar9,iVar13);
  pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar10,(stringstream *)local_1b8);
  __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (
    const char*            rawPixelData,
    const DeepFrameBuffer& frameBuffer,
    int                    scanLine1,
    int                    scanLine2) const
{
    //
    // read header from block - already converted from Xdr to native format
    //
    int      data_scanline            = *(int*) rawPixelData;
    uint64_t sampleCountTableDataSize = *(uint64_t*) (rawPixelData + 4);

    int maxY;
    maxY = min (data_scanline + _data->linesInBuffer - 1, _data->maxY);

    if (scanLine1 != data_scanline)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "readPixelSampleCounts(rawPixelData,frameBuffer,"
                << scanLine1 << ',' << scanLine2
                << ") called with incorrect start scanline - should be "
                << data_scanline);
    }

    if (scanLine2 != maxY)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "readPixelSampleCounts(rawPixelData,frameBuffer,"
                << scanLine1 << ',' << scanLine2
                << ") called with incorrect end scanline - should be " << maxY);
    }

    //
    // If the sample count table is compressed, we'll uncompress it.
    //

    uint64_t rawSampleCountTableSize = (maxY - data_scanline + 1) *
                                       (_data->maxX - _data->minX + 1) *
                                       Xdr::size<unsigned int> ();

    Compressor* decomp = NULL;
    const char* readPtr;
    if (sampleCountTableDataSize < rawSampleCountTableSize)
    {
        decomp = newCompressor (
            _data->header.compression (),
            rawSampleCountTableSize,
            _data->header);

        decomp->uncompress (
            rawPixelData + 28,
            static_cast<int> (sampleCountTableDataSize),
            data_scanline,
            readPtr);
    }
    else
        readPtr = rawPixelData + 28;

    char* base  = frameBuffer.getSampleCountSlice ().base;
    int xStride = static_cast<int> (frameBuffer.getSampleCountSlice ().xStride);
    int yStride = static_cast<int> (frameBuffer.getSampleCountSlice ().yStride);

    for (int y = scanLine1; y <= scanLine2; y++)
    {
        int lastAccumulatedCount = 0;
        for (int x = _data->minX; x <= _data->maxX; x++)
        {
            int accumulatedCount, count;

            //
            // Read the sample count for pixel (x, y).
            //

            Xdr::read<CharPtrIO> (readPtr, accumulatedCount);
            if (x == _data->minX)
                count = accumulatedCount;
            else
                count = accumulatedCount - lastAccumulatedCount;
            lastAccumulatedCount = accumulatedCount;

            //
            // Store the data in both internal and external data structure.
            //

            sampleCount (base, xStride, yStride, x, y) = count;
        }
    }

    if (decomp) { delete decomp; }
}